

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  size_t fi;
  aiVector3D *paVar6;
  long lVar7;
  DeadlyImportError *pDVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  _Self __tmp;
  _List_node_base *p_Var10;
  ulong uVar11;
  allocator local_51;
  string local_50;
  
  p_Var10 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  sVar3 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl._M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pNormalPerVertex) == 0) {
    uVar9 = (ulong)pMesh->mNumFaces;
    if (sVar3 != uVar9) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_50,
                 "MeshGeometry_AddNormal. Normals and faces count must be equal.",&local_51);
      DeadlyImportError::DeadlyImportError(pDVar8,&local_50);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = pMesh->mNumVertices;
    uVar11 = (ulong)uVar1 * 0xc;
    paVar6 = (aiVector3D *)operator_new__(uVar11);
    if ((ulong)uVar1 != 0) {
      uVar11 = uVar11 - 0xc;
      memset(paVar6,0,(uVar11 - uVar11 % 0xc) + 0xc);
    }
    pMesh->mNormals = paVar6;
    for (uVar11 = 0; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      uVar1 = pMesh->mFaces[uVar11].mNumIndices;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        paVar6 = pMesh->mNormals;
        uVar2 = pMesh->mFaces[uVar11].mIndices[uVar9];
        paVar6[uVar2].z = *(float *)&p_Var10[1]._M_prev;
        *(_List_node_base **)(paVar6 + uVar2) = p_Var10[1]._M_next;
      }
      p_Var10 = p_Var10->_M_next;
      uVar9 = (ulong)pMesh->mNumFaces;
    }
  }
  else {
    uVar1 = pMesh->mNumVertices;
    uVar9 = (ulong)uVar1;
    if (sVar3 != uVar9) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_50,
                 "MeshGeometry_AddNormal. Normals and vertices count must be equal.",&local_51);
      DeadlyImportError::DeadlyImportError(pDVar8,&local_50);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar6 = (aiVector3D *)operator_new__(sVar3 * 0xc);
    if (uVar1 != 0) {
      uVar11 = sVar3 * 0xc - 0xc;
      memset(paVar6,0,(uVar11 - uVar11 % 0xc) + 0xc);
    }
    pMesh->mNormals = paVar6;
    lVar7 = 0;
    for (uVar11 = 0; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      p_Var4 = p_Var10[1]._M_next;
      p_Var5 = p_Var10 + 1;
      p_Var10 = p_Var10->_M_next;
      paVar6 = pMesh->mNormals;
      *(undefined4 *)((long)&paVar6->z + lVar7) = *(undefined4 *)&p_Var5->_M_prev;
      *(_List_node_base **)((long)&paVar6->x + lVar7) = p_Var4;
      uVar9 = (ulong)pMesh->mNumVertices;
      lVar7 = lVar7 + 0xc;
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();

	if(pNormalPerVertex)
	{
		if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
	}// if(pNormalPerVertex)
	else
	{
		if(pNormals.size() != pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and faces count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = *norm_it;

			++norm_it;
		}
	}// if(pNormalPerVertex) else
}